

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

char * __thiscall DelayImpEntryWrapper::getLibraryName(DelayImpEntryWrapper *this)

{
  Executable *pEVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  char *ptr;
  addr_type aT;
  uint64_t offset;
  DelayImpEntryWrapper *pDStack_18;
  bool isOk;
  DelayImpEntryWrapper *this_local;
  
  offset._7_1_ = 0;
  pDStack_18 = this;
  uVar4 = ExeElementWrapper::getNumValue((ExeElementWrapper *)this,1,(bool *)((long)&offset + 7));
  if ((offset._7_1_ & 1) == 0) {
    this_local = (DelayImpEntryWrapper *)0x0;
  }
  else {
    uVar2 = (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1a])
                      (this,1,0xffffffffffffffff);
    if (uVar2 == 0) {
      this_local = (DelayImpEntryWrapper *)0x0;
    }
    else {
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,uVar4,(ulong)uVar2,1,0);
      this_local = (DelayImpEntryWrapper *)CONCAT44(extraout_var,iVar3);
      if (this_local == (DelayImpEntryWrapper *)0x0) {
        this_local = (DelayImpEntryWrapper *)0x0;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char* DelayImpEntryWrapper::getLibraryName()
{
    bool isOk = false;
    uint64_t offset = this->getNumValue(DelayImpEntryWrapper::NAME, &isOk);
    if (!isOk) return NULL;

    Executable::addr_type aT = containsAddrType(NAME);
    if (aT == Executable::NOT_ADDR) return NULL;

    char *ptr = (char*) m_Exe->getContentAt(offset, aT, 1);
    if (!ptr) return NULL;

    return ptr;
}